

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::CommonEdgeCase::init(CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  deBool dVar2;
  int extraout_EAX;
  InternalError *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_270;
  undefined1 local_e9;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  CommonEdgeCase *pCStack_10;
  int minViewportSize;
  CommonEdgeCase *this_local;
  
  pCStack_10 = this;
  MultisampleCase::init(&this->super_MultisampleCase,ctx);
  if ((this->m_caseType == CASETYPE_SMALL_QUADS) &&
     (local_14 = 0x20, (this->super_MultisampleCase).m_viewportSize < 0x20)) {
    local_e9 = 1;
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_b8,&(this->super_MultisampleCase).m_viewportSize);
    std::operator+(&local_98,"Render target width or height too low (is ",&local_b8);
    std::operator+(&local_78,&local_98,", should be at least ");
    de::toString<int>(&local_e8,&local_14);
    std::operator+(&local_58,&local_78,&local_e8);
    std::operator+(&local_38,&local_58,")");
    tcu::InternalError::InternalError(this_00,&local_38);
    local_e9 = 0;
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  do {
    glwEnable(0xbe2);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnable(GL_BLEND)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x273);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwBlendEquation(0x8006);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBlendEquation(GL_FUNC_ADD)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x274);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwBlendFunc(1,1);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBlendFunc(GL_ONE, GL_ONE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x275);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  this_01 = tcu::TestContext::getLog
                      ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_270,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_270,
                       (char (*) [79])
                       "Additive blending enabled in order to detect (erroneously) overlapping samples"
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_270);
  return extraout_EAX;
}

Assistant:

void CommonEdgeCase::init (void)
{
	MultisampleCase::init();

	if (m_caseType == CASETYPE_SMALL_QUADS)
	{
		// Check for a big enough viewport. With too small viewports the test case can't analyze the resulting image well enough.

		const int minViewportSize = 32;

		DE_ASSERT(minViewportSize <= getDesiredViewportSize());

		if (m_viewportSize < minViewportSize)
			throw tcu::InternalError("Render target width or height too low (is " + de::toString(m_viewportSize) + ", should be at least " + de::toString(minViewportSize) + ")");
	}

	GLU_CHECK_CALL(glEnable(GL_BLEND));
	GLU_CHECK_CALL(glBlendEquation(GL_FUNC_ADD));
	GLU_CHECK_CALL(glBlendFunc(GL_ONE, GL_ONE));

	m_testCtx.getLog() << TestLog::Message << "Additive blending enabled in order to detect (erroneously) overlapping samples" << TestLog::EndMessage;
}